

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int parse_config_file(char *fn)

{
  int iVar1;
  uint kw;
  int iVar2;
  int nargs;
  parse_state state;
  char *args [64];
  
  state.ptr = (char *)read_file(fn,(uint *)0x0);
  if (state.ptr == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    state.line = 1;
    state.nexttoken = 0;
    state.parse_line = parse_line_no_op;
    state.filename = fn;
    iVar2 = 0;
    while( true ) {
      while (nargs = iVar2, iVar1 = next_token(&state), iVar2 = nargs, iVar1 == 1) {
        if (nargs < 0x40) {
          args[nargs] = state.text;
          iVar2 = nargs + 1;
        }
      }
      if (iVar1 == 0) break;
      if ((iVar1 == 2) && (iVar2 = 0, nargs != 0)) {
        kw = lookup_keyword(args[0]);
        if ((keyword_info[kw].flags & 1) == 0) {
          (*state.parse_line)(&state,nargs,args);
        }
        else {
          (*state.parse_line)(&state,0,(char **)0x0);
          parse_new_section(&state,kw,nargs,args);
          iVar2 = 0;
        }
      }
    }
    iVar2 = 0;
    (*state.parse_line)(&state,0,(char **)0x0);
  }
  return iVar2;
}

Assistant:

int parse_config_file(const char *fn)
{
    char *data;
    data = read_file(fn, 0);
    if (!data) return -1;

    parse_config(fn, data);
    DUMP();
    return 0;
}